

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_aabb.h
# Opt level: O0

_aabb<float> * __thiscall xray_re::_aabb<float>::merge(_aabb<float> *this,_aabb<float> *box)

{
  float *pfVar1;
  float fVar2;
  _aabb<float> *box_local;
  _aabb<float> *this_local;
  
  fVar2 = (this->field_0).field_1.x1;
  if ((box->field_0).field_1.x1 <= fVar2 && fVar2 != (box->field_0).field_1.x1) {
    (this->field_0).field_1.x1 = (box->field_0).field_1.x1;
  }
  fVar2 = (this->field_0).field_1.y1;
  pfVar1 = &(box->field_0).field_1.y1;
  if (*pfVar1 <= fVar2 && fVar2 != *pfVar1) {
    (this->field_0).field_1.y1 = (box->field_0).field_1.y1;
  }
  fVar2 = (this->field_0).field_1.z1;
  pfVar1 = &(box->field_0).field_1.z1;
  if (*pfVar1 <= fVar2 && fVar2 != *pfVar1) {
    (this->field_0).field_1.z1 = (box->field_0).field_1.z1;
  }
  if ((this->field_0).field_1.x2 < (box->field_0).field_1.x2) {
    (this->field_0).field_1.x2 = (box->field_0).field_1.x2;
  }
  if ((this->field_0).field_1.y2 < (box->field_0).field_1.y2) {
    (this->field_0).field_1.y2 = (box->field_0).field_1.y2;
  }
  if ((this->field_0).field_1.z2 < (box->field_0).field_1.z2) {
    (this->field_0).field_1.z2 = (box->field_0).field_1.z2;
  }
  return this;
}

Assistant:

inline _aabb<T>& _aabb<T>::merge(const _aabb<T>& box)
{
	if (x1 > box.x1)
		x1 = box.x1;
	if (y1 > box.y1)
		y1 = box.y1;
	if (z1 > box.z1)
		z1 = box.z1;
	if (x2 < box.x2)
		x2 = box.x2;
	if (y2 < box.y2)
		y2 = box.y2;
	if (z2 < box.z2)
		z2 = box.z2;
	return *this;
}